

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::addUniform(TReflectionTraverser *this,TIntermSymbol *base)

{
  _List_node_header *deref;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  iterator iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TString baseName;
  TList<glslang::TIntermBinary_*> derefs;
  
  baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)base;
  iVar6 = std::
          _Rb_tree<const_TIntermNode_*,_const_TIntermNode_*,_std::_Identity<const_TIntermNode_*>,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
          ::find(&(this->processedDerefs)._M_t,(key_type *)&baseName);
  if ((_Rb_tree_header *)iVar6._M_node ==
      &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header) {
    baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)base;
    std::
    _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
    ::_M_insert_unique<TIntermNode_const*>
              ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                *)&this->processedDerefs,(TIntermNode **)&baseName);
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
    deref = &derefs.
             super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             .
             super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             ._M_impl._M_node;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node._M_size = 0;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = &deref->super__List_node_base;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = &deref->super__List_node_base;
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(base);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&baseName,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2));
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x38))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    if (iVar2 == 0x10) {
      bVar1 = IsAnonymous(&baseName);
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_01,iVar2));
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        assign(&baseName,"");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(&baseName,__str);
      }
      iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      iVar3 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_03,iVar3));
      iVar2 = addBlockName(this,__str,(TType *)CONCAT44(extraout_var_02,iVar2),iVar3);
      iVar3 = 0;
    }
    else {
      iVar3 = -1;
      iVar2 = -1;
    }
    iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
    iVar5 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(base);
    blowUpActiveAggregate
              (this,(TType *)CONCAT44(extraout_var_04,iVar4),&baseName,&derefs,(const_iterator)deref
               ,iVar3,iVar2,0,-1,0,
               *(TStorageQualifier *)(CONCAT44(extraout_var_05,iVar5) + 8) & 0x7f,
               this->updateStageMasks);
  }
  return;
}

Assistant:

void addUniform(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            int blockIndex = -1;
            int offset     = -1;
            TList<TIntermBinary*> derefs;
            TString baseName = base.getName();

            if (base.getType().getBasicType() == EbtBlock) {
                offset = 0;
                bool anonymous = IsAnonymous(baseName);
                const TString& blockName = base.getType().getTypeName();

                if (!anonymous)
                    baseName = blockName;
                else
                    baseName = "";

                blockIndex = addBlockName(blockName, base.getType(), intermediate.getBlockSize(base.getType()));
            }

            // Use a degenerate (empty) set of dereferences to immediately put as at the end of
            // the dereference change expected by blowUpActiveAggregate.
            blowUpActiveAggregate(base.getType(), baseName, derefs, derefs.end(), offset, blockIndex, 0, -1, 0,
                                    base.getQualifier().storage, updateStageMasks);
        }
    }